

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O2

long __thiscall cpp_client::Base_game::go(Base_game *this)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int in_R8D;
  string to_send;
  anon_class_8_1_3e8781ac add_standard_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> game_name;
  string alias;
  undefined1 local_f8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  anon_class_8_1_3e8781ac local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_Delta_mergable)._vptr_Delta_mergable[10])(&local_b0,this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8)
                 ,"{\"event\": \"alias\", \"data\": \"",&local_b0);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8)
                 ,"\"}");
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_b0);
  Connection::send(&this->conn_,(int)&local_50,__buf,in_RCX,in_R8D);
  std::__cxx11::string::string((string *)&local_b0,"named",(allocator *)local_d0[0]._M_local_buf);
  handle_response((Base_game *)local_f8,(string *)this);
  psVar2 = (string *)
           (**(code **)(*(long *)*(unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                                   *)local_f8._0_8_ + 0x18))();
  std::__cxx11::string::string((string *)(local_78 + 8),psVar2);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_f8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "{\"event\": \"play\", \"data\": {\"clientType\": \"c++\", \"playerIndex\": ",
             (allocator *)local_f8);
  if (this->player_index_ == -1) {
    std::__cxx11::string::append((char *)&local_b0);
  }
  else {
    std::__cxx11::to_string((string *)local_d0,this->player_index_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,","
                  );
    std::__cxx11::string::append((string *)&local_b0);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
  }
  local_90.to_send = &local_b0;
  std::__cxx11::string::string((string *)local_f8,"password",(allocator *)local_d0[0]._M_local_buf);
  go::anon_class_8_1_3e8781ac::operator()(&local_90,(string *)local_f8,&this->password_);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::string
            ((string *)local_f8,"requestedSession",(allocator *)local_d0[0]._M_local_buf);
  go::anon_class_8_1_3e8781ac::operator()(&local_90,(string *)local_f8,&this->session_);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::string
            ((string *)local_f8,"gameSettings",(allocator *)local_d0[0]._M_local_buf);
  go::anon_class_8_1_3e8781ac::operator()(&local_90,(string *)local_f8,&this->game_settings_);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::append((char *)&local_b0);
  bVar1 = std::operator==(&this->name_,"");
  if (bVar1) {
    (**((this->ai_)._M_t.
        super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>._M_t.
        super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>.
        super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl)->_vptr_Base_ai)(local_f8);
    std::__cxx11::string::append((string *)&local_b0);
    std::__cxx11::string::~string((string *)local_f8);
  }
  else {
    std::__cxx11::string::append((string *)&local_b0);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "\",\"gameName\":\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 8)
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 "\"}}");
  std::__cxx11::string::append((string *)&local_b0);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_d0[0]._M_local_buf);
  Connection::send(&this->conn_,(int)&local_b0,__buf_00,in_RCX,in_R8D);
  std::__cxx11::string::string((string *)local_f8,"lobbied",(allocator *)local_d0[0]._M_local_buf);
  handle_response((Base_game *)local_78,(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_78);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::string((string *)local_f8,"delta",(allocator *)local_d0[0]._M_local_buf);
  handle_response((Base_game *)(local_88 + 8),(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)(local_88 + 8));
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::string((string *)local_f8,"start",(allocator *)local_d0[0]._M_local_buf);
  handle_response((Base_game *)local_88,(string *)this);
  std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
            ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)local_88);
  std::__cxx11::string::~string((string *)local_f8);
  do {
    std::__cxx11::string::string((string *)local_f8,"",(allocator *)(local_f8 + 0x27));
    handle_response((Base_game *)local_d0,(string *)this);
    lVar3 = *(long *)local_d0[0]._0_8_;
    std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::~unique_ptr
              ((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> *)
               &local_d0[0]._M_allocated_capacity);
    std::__cxx11::string::~string((string *)local_f8);
  } while (lVar3 != 0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  lVar3 = std::__cxx11::string::~string((string *)&local_50);
  return lVar3;
}

Assistant:

void Base_game::go()
{
   //grab the name first (do this again to ensure proper server-side name)
   std::string alias = R"({"event": "alias", "data": ")" + get_game_name() + "\"}";
   conn_.send(alias);
   const auto game_name = handle_response("named")->as<std::string>();
   //start with the same thing each time
   std::string to_send = R"({"event": "play", "data": {"clientType": "c++", "playerIndex": )";
   //now fill in the details
   if(player_index_ == -1)
   {
      to_send += "null,";
   }
   else
   {
      to_send += std::to_string(player_index_) + ",";
   }
   const auto add_standard_str = [&to_send](const std::string& name, const std::string& to_add)
      {
         to_send += "\"" + name + "\":";
         if(to_add == "")
         {
            to_send += "null,";
         }
         else
         {
            to_send += "\"" + to_add + "\",";
         }
      };
   add_standard_str("password", password_);
   add_standard_str("requestedSession", session_);
   add_standard_str("gameSettings", game_settings_);
   to_send += R"("playerName":")";
   if(name_ == "")
   {
      to_send += ai_->get_name();
   }
   else
   {
      to_send += name_;
   }
   to_send += R"(","gameName":")" + game_name + R"("}})";
   conn_.send(to_send);
   //Expecting the "lobbied" message
   handle_response("lobbied");
   //Next the delta message will be received
   handle_response("delta");
   //Start should be next
   handle_response("start");
   //now just do normal handling of events
   while(*handle_response())
   {
      //Intentionally empty
   }
}